

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O0

Curl_addrinfo * Curl_he2ai(hostent *he,int port)

{
  in_addr_t iVar1;
  char *pcVar2;
  undefined8 uVar3;
  curl_socklen_t cVar4;
  uint16_t uVar5;
  Curl_addrinfo *pCVar6;
  char *pcVar7;
  sockaddr *psVar8;
  size_t ss_size;
  char *curr;
  int i;
  CURLcode result;
  sockaddr_in6 *addr6;
  sockaddr_in *addr;
  Curl_addrinfo *firstai;
  Curl_addrinfo *prevai;
  Curl_addrinfo *ai;
  int port_local;
  hostent *he_local;
  
  firstai = (Curl_addrinfo *)0x0;
  addr = (sockaddr_in *)0x0;
  curr._4_4_ = 0;
  if (he == (hostent *)0x0) {
    he_local = (hostent *)0x0;
  }
  else {
    for (curr._0_4_ = 0; pcVar2 = he->h_addr_list[(int)curr], pcVar2 != (char *)0x0;
        curr._0_4_ = (int)curr + 1) {
      if (he->h_addrtype == 10) {
        cVar4 = 0x1c;
      }
      else {
        cVar4 = 0x10;
      }
      pCVar6 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x30);
      if (pCVar6 == (Curl_addrinfo *)0x0) {
        curr._4_4_ = 0x1b;
        break;
      }
      pcVar7 = (*Curl_cstrdup)(he->h_name);
      pCVar6->ai_canonname = pcVar7;
      if (pcVar7 == (char *)0x0) {
        curr._4_4_ = 0x1b;
        (*Curl_cfree)(pCVar6);
        break;
      }
      psVar8 = (sockaddr *)(*Curl_ccalloc)(1,(size_t)cVar4);
      pCVar6->ai_addr = psVar8;
      if (psVar8 == (sockaddr *)0x0) {
        curr._4_4_ = 0x1b;
        (*Curl_cfree)(pCVar6->ai_canonname);
        (*Curl_cfree)(pCVar6);
        break;
      }
      if (addr == (sockaddr_in *)0x0) {
        addr = (sockaddr_in *)pCVar6;
      }
      if (firstai != (Curl_addrinfo *)0x0) {
        firstai->ai_next = pCVar6;
      }
      ((in_addr *)&pCVar6->ai_family)->s_addr = he->h_addrtype;
      pCVar6->ai_socktype = 1;
      pCVar6->ai_addrlen = cVar4;
      iVar1 = ((in_addr *)&pCVar6->ai_family)->s_addr;
      if (iVar1 == 2) {
        psVar8 = pCVar6->ai_addr;
        *(undefined4 *)(psVar8->sa_data + 2) = *(undefined4 *)pcVar2;
        psVar8->sa_family = (sa_family_t)he->h_addrtype;
        uVar5 = htons((uint16_t)port);
        *(uint16_t *)psVar8->sa_data = uVar5;
      }
      else if (iVar1 == 10) {
        psVar8 = pCVar6->ai_addr;
        *(undefined8 *)(psVar8->sa_data + 6) = *(undefined8 *)pcVar2;
        uVar3 = *(undefined8 *)(pcVar2 + 8);
        psVar8[1].sa_family = (short)uVar3;
        psVar8[1].sa_data[0] = (char)((ulong)uVar3 >> 0x10);
        psVar8[1].sa_data[1] = (char)((ulong)uVar3 >> 0x18);
        psVar8[1].sa_data[2] = (char)((ulong)uVar3 >> 0x20);
        psVar8[1].sa_data[3] = (char)((ulong)uVar3 >> 0x28);
        psVar8[1].sa_data[4] = (char)((ulong)uVar3 >> 0x30);
        psVar8[1].sa_data[5] = (char)((ulong)uVar3 >> 0x38);
        psVar8->sa_family = (sa_family_t)he->h_addrtype;
        uVar5 = htons((uint16_t)port);
        *(uint16_t *)psVar8->sa_data = uVar5;
      }
      firstai = pCVar6;
    }
    if (curr._4_4_ != 0) {
      Curl_freeaddrinfo((Curl_addrinfo *)addr);
      addr = (sockaddr_in *)0x0;
    }
    he_local = (hostent *)addr;
  }
  return (Curl_addrinfo *)he_local;
}

Assistant:

Curl_addrinfo *
Curl_he2ai(const struct hostent *he, int port)
{
  Curl_addrinfo *ai;
  Curl_addrinfo *prevai = NULL;
  Curl_addrinfo *firstai = NULL;
  struct sockaddr_in *addr;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 *addr6;
#endif
  CURLcode result = CURLE_OK;
  int i;
  char *curr;

  if(!he)
    /* no input == no output! */
    return NULL;

  DEBUGASSERT((he->h_name != NULL) && (he->h_addr_list != NULL));

  for(i=0; (curr = he->h_addr_list[i]) != NULL; i++) {

    size_t ss_size;
#ifdef ENABLE_IPV6
    if(he->h_addrtype == AF_INET6)
      ss_size = sizeof (struct sockaddr_in6);
    else
#endif
      ss_size = sizeof (struct sockaddr_in);

    if((ai = calloc(1, sizeof(Curl_addrinfo))) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      break;
    }
    if((ai->ai_canonname = strdup(he->h_name)) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai);
      break;
    }
    if((ai->ai_addr = calloc(1, ss_size)) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai->ai_canonname);
      free(ai);
      break;
    }

    if(!firstai)
      /* store the pointer we want to return from this function */
      firstai = ai;

    if(prevai)
      /* make the previous entry point to this */
      prevai->ai_next = ai;

    ai->ai_family = he->h_addrtype;

    /* we return all names as STREAM, so when using this address for TFTP
       the type must be ignored and conn->socktype be used instead! */
    ai->ai_socktype = SOCK_STREAM;

    ai->ai_addrlen = (curl_socklen_t)ss_size;

    /* leave the rest of the struct filled with zero */

    switch (ai->ai_family) {
    case AF_INET:
      addr = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr->sin_addr, curr, sizeof(struct in_addr));
      addr->sin_family = (unsigned short)(he->h_addrtype);
      addr->sin_port = htons((unsigned short)port);
      break;

#ifdef ENABLE_IPV6
    case AF_INET6:
      addr6 = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr6->sin6_addr, curr, sizeof(struct in6_addr));
      addr6->sin6_family = (unsigned short)(he->h_addrtype);
      addr6->sin6_port = htons((unsigned short)port);
      break;
#endif
    }

    prevai = ai;
  }

  if(result) {
    Curl_freeaddrinfo(firstai);
    firstai = NULL;
  }

  return firstai;
}